

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_lref(ASMState *as,IRIns *ir)

{
  ASMState *in_RSI;
  undefined8 in_RDI;
  Reg r;
  ASMState *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  ra_dest(in_RSI,(IRIns *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),0);
  ra_left(unaff_retaddr,(Reg)((ulong)in_RDI >> 0x20),(IRRef)in_RDI);
  return;
}

Assistant:

static void asm_lref(ASMState *as, IRIns *ir)
{
  Reg r = ra_dest(as, ir, RSET_GPR);
#if LJ_TARGET_X86ORX64
  ra_left(as, r, ASMREF_L);
#else
  ra_leftov(as, r, ASMREF_L);
#endif
}